

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdtarga.c
# Opt level: O1

JDIMENSION get_8bit_gray_row(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  JDIMENSION JVar1;
  JSAMPROW pJVar2;
  long lVar3;
  
  JVar1 = cinfo->image_width;
  if (JVar1 != 0) {
    pJVar2 = *sinfo->buffer;
    lVar3 = 0;
    do {
      (*(code *)sinfo[1].buffer)(sinfo);
      pJVar2[lVar3] = (JSAMPLE)sinfo[1].buffer_height;
      lVar3 = lVar3 + 1;
    } while (JVar1 != (JDIMENSION)lVar3);
  }
  return 1;
}

Assistant:

METHODDEF(JDIMENSION)
get_8bit_gray_row(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
/* This version is for reading 8-bit grayscale pixels */
{
  tga_source_ptr source = (tga_source_ptr)sinfo;
  register JSAMPROW ptr;
  register JDIMENSION col;

  ptr = source->pub.buffer[0];
  for (col = cinfo->image_width; col > 0; col--) {
    (*source->read_pixel) (source); /* Load next pixel into tga_pixel */
    *ptr++ = (JSAMPLE)UCH(source->tga_pixel[0]);
  }
  return 1;
}